

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

int deqp::gles3::Functional::FboTestUtil::calculateU8ConversionError(int srcBits)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  float fVar4;
  
  if (0 < srcBits) {
    bVar2 = 8;
    if ((uint)srcBits < 8) {
      bVar2 = (byte)srcBits;
    }
    fVar4 = ceilf(510.0 / (float)~(-1 << (bVar2 & 0x1f)));
    iVar3 = 0xff;
    if ((int)fVar4 < 0xff) {
      iVar3 = (int)fVar4;
    }
    iVar1 = 0;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    return iVar1;
  }
  return 1;
}

Assistant:

static int calculateU8ConversionError (int srcBits)
{
	if (srcBits > 0)
	{
		const int clampedBits	= de::clamp<int>(srcBits, 0, 8);
		const int srcMaxValue	= de::max((1<<clampedBits) - 1, 1);
		const int error			= int(deFloatCeil(255.0f * 2.0f / float(srcMaxValue)));

		return de::clamp<int>(error, 0, 255);
	}
	else
		return 1;
}